

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

void __thiscall duckdb::TupleDataCollection::Print(TupleDataCollection *this)

{
  string sStack_28;
  
  ToString_abi_cxx11_(&sStack_28,this);
  Printer::Print((string *)&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void TupleDataCollection::Print() {
	Printer::Print(ToString());
}